

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O2

void __thiscall BitmapResult::writeMonoAlphaRGBFull(BitmapResult *this,FILE *file,png_bytepp rows)

{
  png_byte *ppVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint32_t x;
  ulong uVar8;
  ushort uVar10;
  undefined1 auVar9 [15];
  ushort local_42;
  png_bytepp local_40;
  ulong local_38;
  
  local_40 = rows;
  for (local_38 = 0; local_38 < this->m_height; local_38 = local_38 + 1) {
    ppVar1 = local_40[local_38];
    uVar7 = 0;
    for (uVar8 = 0; uVar8 < this->m_width; uVar8 = uVar8 + 1) {
      auVar9 = ZEXT215(*(ushort *)(ppVar1 + uVar7) >> 3) & DAT_0010f750._0_15_;
      auVar5._9_7_ = 0;
      auVar5._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
      auVar4._10_6_ = 0;
      auVar4._0_10_ = SUB1610(auVar5 << 0x38,6);
      auVar3._11_5_ = 0;
      auVar3._0_11_ = SUB1611(auVar4 << 0x30,5);
      auVar6._12_4_ = 0;
      auVar6._0_12_ = SUB1612(auVar3 << 0x28,4);
      auVar2._1_13_ = SUB1613(auVar6 << 0x20,3);
      auVar2[0] = auVar9[1];
      uVar10 = auVar2._0_2_ * 0x20;
      local_42 = (ushort)((ushort)auVar9[0] * 0x400 |
                          (ushort)(ppVar1[(ulong)uVar7 + 3] == 0xff) << 0xf | uVar10) >> 8 |
                 (ppVar1[(ulong)uVar7 + 2] >> 3 | uVar10) << 8;
      fwrite(&local_42,2,1,(FILE *)file);
      uVar7 = uVar7 + 4;
    }
  }
  return;
}

Assistant:

void BitmapResult::writeMonoAlphaRGBFull(FILE *file, png_bytepp rows){
    for(uint32_t y=0;y<m_height;y++){
        png_bytep row = rows[y];
        for(uint32_t x=0;x<m_width;x++){
            png_bytep p = &row[x*4];
            uint16_t pixel = 0;
            //What the fuck! Why is the endianness flipped? Honestly, just shoot me at this point
            pixel |= ((uint16_t)(p[0]/8)) <<10; //r
            pixel |= ((uint16_t)(p[1]/8)) <<5; //g
            pixel |= ((uint16_t)(p[2]/8)) <<0; //b
            pixel |= ((uint16_t)(p[3]/255)) <<15; //a
            pixel = ((pixel&0xff00)>>8)|((pixel&0x00ff)<<8); //flip endianness
            fwrite(&pixel,2,1,file);
        }
    }
}